

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar1;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                     (&(source_code_info->field_0)._impl_.location_.super_RepeatedPtrFieldBase);
  this->location_ = pVVar1;
  RepeatedField<int>::CopyFrom
            (&(pVVar1->field_0)._impl_.path_,&(parent->location_->field_0)._impl_.path_);
  RepeatedField<int>::Add
            (&(this->location_->field_0)._impl_.span_,(this->parser_->input_->current_).line);
  RepeatedField<int>::Add
            (&(this->location_->field_0)._impl_.span_,(this->parser_->input_->current_).column);
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}